

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

void target_add_ret_ops(c2m_ctx_t c2m_ctx,type *ret_type,op_t res)

{
  op_t val;
  op_t var_00;
  gen_ctx_conflict *pgVar1;
  undefined1 auVar2 [32];
  MIR_context_t ctx_00;
  int iVar3;
  MIR_type_t t;
  MIR_insn_code_t code;
  MIR_reg_t base;
  MIR_insn_t_conflict insn_00;
  mir_size_t size;
  undefined1 auVar4 [64];
  undefined1 auVar5 [48];
  undefined1 in_stack_fffffffffffffd98 [64];
  undefined1 auVar14 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  MIR_op_t local_1b8;
  op_t local_188;
  MIR_op_t local_148;
  op_t local_118;
  int local_d0;
  int local_cc;
  int n_qwords;
  int i;
  op_t var;
  op_t temp;
  MIR_reg_t ret_addr_reg;
  MIR_insn_t_conflict insn;
  MIR_type_t qword_types [2];
  MIR_type_t type;
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  type *ret_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  unique0x00012000 = c2m_ctx->ctx;
  iVar3 = void_type_p(ret_type);
  if (iVar3 == 0) {
    local_d0 = process_ret_type(c2m_ctx,ret_type,(MIR_type_t *)((long)&insn + 4));
    auVar14 = in_stack_fffffffffffffd98._4_60_;
    if (local_d0 == 0) {
      if ((ret_type->mode == TM_STRUCT) || (ret_type->mode == TM_UNION)) {
        base = MIR_reg(stack0xffffffffffffffd8,RET_ADDR_NAME,(pgVar1->curr_func->u).func);
        auVar4._4_60_ = auVar14;
        auVar4._0_4_ = 1;
        MIR_new_mem_op(&local_1b8,stack0xffffffffffffffd8,MIR_T_I8,0,base,0,'\x01');
        auVar12._0_16_ = auVar4._0_16_;
        auVar12._16_8_ = local_1b8.u.i;
        auVar12._24_8_ = local_1b8.u.str.s;
        auVar12._32_8_ = local_1b8.u._16_8_;
        auVar12._48_16_ = auVar4._48_16_;
        auVar12._40_8_ = local_1b8.u.mem.disp;
        auVar13._8_8_ = local_1b8._8_8_;
        auVar13._0_8_ = local_1b8.data;
        auVar13._16_8_ = local_1b8.u.i;
        auVar13._32_32_ = auVar12._32_32_;
        auVar13._24_8_ = local_1b8.u.str.s;
        new_op(&local_188,(decl_t)0x0,auVar13._0_48_);
        memcpy(&n_qwords,&local_188,0x40);
        size = type_size(c2m_ctx,ret_type);
        auVar4 = vmovdqu64_avx512f((undefined1  [64])res);
        val = (op_t)vmovdqu64_avx512f(auVar4);
        auVar4 = vmovdqu64_avx512f(_n_qwords);
        var_00 = (op_t)vmovdqu64_avx512f(auVar4);
        block_move(c2m_ctx,var_00,val,size);
      }
      else {
        auVar2 = (undefined1  [32])res.mir_op._0_32_;
        auVar10._0_16_ = in_stack_fffffffffffffd98._0_16_;
        auVar10._16_8_ = res.mir_op.u.i;
        auVar10._24_8_ = res.mir_op.u.str.s;
        auVar10._32_8_ = res.mir_op.u._16_8_;
        auVar10._48_16_ = in_stack_fffffffffffffd98._48_16_;
        auVar10._40_8_ = res.mir_op.u.mem.disp;
        auVar11._32_32_ = auVar10._32_32_;
        auVar11._0_32_ = auVar2;
        VARR_MIR_op_tpush(pgVar1->ret_ops,auVar11._0_48_);
      }
    }
    else {
      for (local_cc = 0; auVar5 = in_stack_fffffffffffffd98._4_48_, local_cc < local_d0;
          local_cc = local_cc + 1) {
        qword_types[0] = *(MIR_type_t *)((long)&insn + (long)local_cc * 4 + 4);
        t = promote_mir_int_type(qword_types[0]);
        get_new_temp(&local_118,c2m_ctx,t);
        memcpy((void *)((long)&var.mir_op.u + 0x18),&local_118,0x40);
        ctx_00 = stack0xffffffffffffffd8;
        code = tp_mov(qword_types[0]);
        auVar5 = auVar5 << 0x20;
        MIR_new_mem_op(&local_148,stack0xffffffffffffffd8,qword_types[0],
                       res.mir_op.u.mem.disp + (local_cc << 3),res.mir_op.u.mem.base,
                       res.mir_op.u.mem.index,res.mir_op.u.mem.scale);
        auVar6._48_8_ = local_148.data;
        auVar6._0_48_ = auVar5;
        auVar6._56_8_ = local_148._8_8_;
        auVar8._8_8_ = temp.mir_op.data;
        auVar8._0_8_ = temp._8_8_;
        auVar8._16_8_ = temp.mir_op._8_8_;
        auVar8._24_8_ = temp.mir_op.u.i;
        auVar7._0_16_ = auVar5._0_16_;
        auVar7._16_8_ = temp.mir_op._8_8_;
        auVar7._24_8_ = temp.mir_op.u.i;
        auVar7._32_8_ = temp.mir_op.u.str.s;
        auVar7._48_16_ = auVar6._48_16_;
        auVar7._40_8_ = temp.mir_op.u._16_8_;
        auVar8._32_32_ = auVar7._32_32_;
        insn_00 = MIR_new_insn(ctx_00,code);
        MIR_append_insn(stack0xffffffffffffffd8,pgVar1->curr_func,insn_00);
        auVar9._0_16_ = auVar8._0_16_;
        auVar9._16_8_ = temp.mir_op._8_8_;
        auVar9._24_8_ = temp.mir_op.u.i;
        auVar9._32_8_ = temp.mir_op.u.str.s;
        auVar9._48_16_ = auVar8._48_16_;
        auVar9._40_8_ = temp.mir_op.u._16_8_;
        in_stack_fffffffffffffd98._8_8_ = temp.mir_op.data;
        in_stack_fffffffffffffd98._0_8_ = temp._8_8_;
        in_stack_fffffffffffffd98._16_8_ = temp.mir_op._8_8_;
        in_stack_fffffffffffffd98._32_32_ = auVar9._32_32_;
        in_stack_fffffffffffffd98._24_8_ = temp.mir_op.u.i;
        VARR_MIR_op_tpush(pgVar1->ret_ops,in_stack_fffffffffffffd98._0_48_);
      }
    }
  }
  return;
}

Assistant:

static void target_add_ret_ops (c2m_ctx_t c2m_ctx, struct type *ret_type, op_t res) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  MIR_insn_t insn;
  MIR_reg_t ret_addr_reg;
  op_t temp, var;
  int i, n_qwords;

  if (void_type_p (ret_type)) return;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    for (i = 0; i < n_qwords; i++) {
      type = qword_types[i];
      temp = get_new_temp (c2m_ctx, promote_mir_int_type (type));
      insn = MIR_new_insn (ctx, tp_mov (type), temp.mir_op,
                           MIR_new_mem_op (ctx, type, res.mir_op.u.mem.disp + 8 * i,
                                           res.mir_op.u.mem.base, res.mir_op.u.mem.index,
                                           res.mir_op.u.mem.scale));
      MIR_append_insn (ctx, curr_func, insn);
      VARR_PUSH (MIR_op_t, ret_ops, temp.mir_op);
    }
  } else if (ret_type->mode != TM_STRUCT && ret_type->mode != TM_UNION) {
    VARR_PUSH (MIR_op_t, ret_ops, res.mir_op);
  } else {
    ret_addr_reg = MIR_reg (ctx, RET_ADDR_NAME, curr_func->u.func);
    var = new_op (NULL, MIR_new_mem_op (ctx, MIR_T_I8, 0, ret_addr_reg, 0, 1));
    block_move (c2m_ctx, var, res, type_size (c2m_ctx, ret_type));
  }
}